

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

bool dg::vr::Relations::transitiveOver(Type fst,Type snd)

{
  int in_ESI;
  undefined4 in_EDI;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_1;
  
  switch(in_EDI) {
  case 0:
  case 1:
  case 10:
  case 0xb:
    local_1 = false;
    break;
  case 2:
  case 3:
    local_19 = in_ESI == 2 || in_ESI == 3;
    local_1 = local_19;
    break;
  case 4:
  case 5:
    local_1a = in_ESI == 4 || in_ESI == 5;
    local_1 = local_1a;
    break;
  case 6:
  case 7:
    local_1b = in_ESI == 6 || in_ESI == 7;
    local_1 = local_1b;
    break;
  case 8:
  case 9:
    local_1c = in_ESI == 8 || in_ESI == 9;
    local_1 = local_1c;
    break;
  default:
    abort();
  }
  return local_1;
}

Assistant:

bool Relations::transitiveOver(Type fst, Type snd) {
    switch (fst) {
    case SLE:
    case SLT:
        return snd == SLE || snd == SLT;
    case ULE:
    case ULT:
        return snd == ULE || snd == ULT;
    case SGE:
    case SGT:
        return snd == SGE || snd == SGT;
    case UGE:
    case UGT:
        return snd == UGE || snd == UGT;
    case EQ:
    case NE:
    case PT:
    case PF:
        return false;
    }
    assert(0 && "unreachable");
    abort();
}